

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O3

void PulseThread(void *Arg)

{
  undefined4 uVar1;
  
  OSSignal_Wait(*(OS_SIGNAL **)((long)Arg + 0x38));
  while( true ) {
    if (*(char *)((long)Arg + 8) != '\x01') {
      return;
    }
    OSMutex_Lock(*(OS_MUTEX **)((long)Arg + 0x40));
    if ((*(char *)((long)Arg + 0x50) == '\0') && (*(code **)((long)Arg + 0x68) != (code *)0x0))
    break;
    OSMutex_Unlock(*(OS_MUTEX **)((long)Arg + 0x40));
    do {
      usleep(1000);
LAB_001119f7:
    } while ((*(long *)((long)Arg + 0x68) == 0) && (*(char *)((long)Arg + 8) == '\x01'));
  }
  uVar1 = (**(code **)((long)Arg + 0x68))
                    (*Arg,*(undefined8 *)((long)Arg + 0x60),*(undefined4 *)((long)Arg + 0x1c),
                     *(undefined8 *)((long)Arg + 0x28));
  pa_simple_write(*(undefined8 *)((long)Arg + 0x48),*(undefined8 *)((long)Arg + 0x28),uVar1,0);
  OSMutex_Unlock(*(OS_MUTEX **)((long)Arg + 0x40));
  goto LAB_001119f7;
}

Assistant:

static void PulseThread(void* Arg)
{
	DRV_PULSE* drv = (DRV_PULSE*)Arg;
	UINT32 didBuffers;	// number of processed buffers
	UINT32 bufBytes;
	int retVal;
	
	OSSignal_Wait(drv->hSignal);	// wait until the initialization is done
	
	while(drv->devState == 1)
	{
		didBuffers = 0;
		OSMutex_Lock(drv->hMutex);
		if (! drv->pauseThread && drv->FillBuffer != NULL)
		{
			bufBytes = drv->FillBuffer(drv->audDrvPtr, drv->userParam, drv->bufSize, drv->bufSpace);
			retVal = pa_simple_write(drv->hPulse, drv->bufSpace, (size_t) bufBytes, NULL);
			didBuffers ++;
		}
		OSMutex_Unlock(drv->hMutex);
		if (! didBuffers)
			Sleep(1);
		
		while(drv->FillBuffer == NULL && drv->devState == 1)
			Sleep(1);
	}
	
	return;
}